

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshUtilities.cpp
# Opt level: O1

void Rml::MeshUtilities::GenerateBackgroundBorder
               (Mesh *out_mesh,RenderBox *render_box,ColourbPremultiplied background_color,
               ColourbPremultiplied *border_colors)

{
  int *piVar1;
  pointer pVVar2;
  pointer pVVar3;
  code *pcVar4;
  EdgeSizes edge_sizes;
  EdgeSizes edge_sizes_00;
  bool bVar5;
  int i;
  long lVar6;
  int iVar7;
  int *piVar8;
  GeometryBackgroundBorder geometry;
  BorderMetrics metrics;
  GeometryBackgroundBorder local_f8;
  Vector2f local_e8;
  undefined8 uStack_e0;
  undefined8 local_d0;
  undefined8 uStack_c8;
  BorderMetrics local_c0;
  
  if (border_colors == (ColourbPremultiplied *)0x0) {
    bVar5 = Assert("RMLUI_ASSERT(border_colors)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/MeshUtilities.cpp"
                   ,0x58);
    if (!bVar5) {
LAB_0024c6e1:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
  }
  edge_sizes_00._M_elems = *&(render_box->border_widths)._M_elems;
  edge_sizes._M_elems = *&(render_box->border_widths)._M_elems;
  local_d0 = *(undefined8 *)(render_box->border_widths)._M_elems;
  uStack_c8 = *(undefined8 *)((render_box->border_widths)._M_elems + 2);
  lVar6 = 0;
  iVar7 = 0;
  do {
    if ((border_colors[lVar6].alpha != '\0') && (0.0 < *(float *)((long)&local_d0 + lVar6 * 4))) {
      iVar7 = iVar7 + 1;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  local_e8 = render_box->fill_size;
  bVar5 = false;
  if ((0xffffff < (uint)background_color) && (bVar5 = false, 0.0 < local_e8.x)) {
    bVar5 = 0.0 < local_e8.y;
  }
  if ((0 < iVar7 | bVar5) == 1) {
    uStack_e0 = 0;
    ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
              (&out_mesh->vertices,
               (long)(int)((int)((ulong)((long)(out_mesh->vertices).
                                               super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(out_mesh->vertices).
                                              super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                           -0x33333333 + iVar7 * 2 + (uint)bVar5 * 4));
    ::std::vector<int,_std::allocator<int>_>::reserve
              (&out_mesh->indices,
               (long)(int)((iVar7 * 2 + (uint)bVar5 * 2) * 3 +
                          (int)((ulong)((long)(out_mesh->indices).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish -
                                       (long)(out_mesh->indices).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start) >> 2)));
    GeometryBackgroundBorder::GeometryBackgroundBorder
              (&local_f8,&out_mesh->vertices,&out_mesh->indices);
    GeometryBackgroundBorder::ComputeBorderMetrics
              (&local_c0,render_box->border_offset,edge_sizes,local_e8,
               (CornerSizes)*&(render_box->border_radius)._M_elems);
    if (bVar5 != false) {
      GeometryBackgroundBorder::DrawBackground(&local_f8,&local_c0,background_color);
    }
    if (0 < iVar7) {
      GeometryBackgroundBorder::DrawBorder(&local_f8,&local_c0,edge_sizes_00,border_colors);
    }
    piVar8 = (out_mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (out_mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar8 != piVar1) {
      pVVar2 = (out_mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pVVar3 = (out_mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        if ((int)((ulong)((long)pVVar2 - (long)pVVar3) >> 2) * -0x33333333 <= *piVar8) {
          bVar5 = Assert("RMLUI_ASSERT(index < num_vertices)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/MeshUtilities.cpp"
                         ,0x8d);
          if (!bVar5) goto LAB_0024c6e1;
        }
        piVar8 = piVar8 + 1;
      } while (piVar8 != piVar1);
    }
  }
  return;
}

Assistant:

void MeshUtilities::GenerateBackgroundBorder(Mesh& out_mesh, const RenderBox& render_box, ColourbPremultiplied background_color,
	const ColourbPremultiplied border_colors[4])
{
	RMLUI_ASSERT(border_colors);

	Vector<Vertex>& vertices = out_mesh.vertices;
	Vector<int>& indices = out_mesh.indices;

	const EdgeSizes& border_widths = render_box.GetBorderWidths();
	int num_borders = 0;
	for (int i = 0; i < 4; i++)
		if (border_colors[i].alpha > 0 && border_widths[i] > 0)
			num_borders += 1;

	const Vector2f fill_size = render_box.GetFillSize();
	const bool has_background = (background_color.alpha > 0 && fill_size.x > 0 && fill_size.y > 0);
	const bool has_border = (num_borders > 0);

	if (!has_background && !has_border)
		return;

	// Reserve geometry. A conservative estimate, does not take border-radii into account and assumes same-colored borders.
	const int estimated_num_vertices = 4 * int(has_background) + 2 * num_borders;
	const int estimated_num_triangles = 2 * int(has_background) + 2 * num_borders;
	vertices.reserve((int)vertices.size() + estimated_num_vertices);
	indices.reserve((int)indices.size() + 3 * estimated_num_triangles);

	// Generate the geometry.
	GeometryBackgroundBorder geometry(vertices, indices);
	const BorderMetrics metrics =
		GeometryBackgroundBorder::ComputeBorderMetrics(render_box.GetBorderOffset(), border_widths, fill_size, render_box.GetBorderRadius());

	if (has_background)
		geometry.DrawBackground(metrics, background_color);

	if (has_border)
		geometry.DrawBorder(metrics, border_widths, border_colors);

#if 0
	// Debug draw vertices
	if (render_box.border_radius != CornerSizes{})
	{
		const int num_vertices = (int)vertices.size();
		const int num_indices = (int)indices.size();
		vertices.reserve(num_vertices + 4 * num_vertices);
		indices.reserve(num_indices + 6 * num_indices);

		for (int i = 0; i < num_vertices; i++)
			MeshUtilities::GenerateQuad(out_mesh, vertices[i].position, Vector2f(3, 3), ColourbPremultiplied(255, 0, (i % 2) == 0 ? 0 : 255));
	}
#endif

#ifdef RMLUI_DEBUG
	const int num_vertices = (int)vertices.size();
	for (int index : indices)
	{
		RMLUI_ASSERT(index < num_vertices);
	}
#endif
}